

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::torrent_update_alert::~torrent_update_alert(torrent_update_alert *this)

{
  torrent_update_alert *this_local;
  
  ~torrent_update_alert(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

struct TORRENT_DEPRECATED_EXPORT torrent_update_alert final : torrent_alert
	{
		// internal
		torrent_update_alert(aux::stack_allocator& alloc, torrent_handle h
			, sha1_hash const& old_hash, sha1_hash const& new_hash);

		TORRENT_DEFINE_ALERT_PRIO(torrent_update_alert, 71, alert_priority_critical)

		static constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;

		// ``old_ih`` and ``new_ih`` are the previous and new info-hash for the torrent, respectively.
		sha1_hash old_ih;
		sha1_hash new_ih;
	}